

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O1

uint8_t * VP8LBitWriterFinish(VP8LBitWriter *bw)

{
  uint8_t *puVar1;
  int iVar2;
  
  iVar2 = VP8LBitWriterResize(bw,(long)(bw->used_ + 7 >> 3));
  if (iVar2 != 0) {
    if (0 < bw->used_) {
      do {
        puVar1 = bw->cur_;
        bw->cur_ = puVar1 + 1;
        *puVar1 = (uint8_t)bw->bits_;
        bw->bits_ = bw->bits_ >> 8;
        iVar2 = bw->used_;
        bw->used_ = iVar2 + -8;
      } while (8 < iVar2);
    }
    bw->used_ = 0;
  }
  return bw->buf_;
}

Assistant:

uint8_t* VP8LBitWriterFinish(VP8LBitWriter* const bw) {
  // flush leftover bits
  if (VP8LBitWriterResize(bw, (bw->used_ + 7) >> 3)) {
    while (bw->used_ > 0) {
      *bw->cur_++ = (uint8_t)bw->bits_;
      bw->bits_ >>= 8;
      bw->used_ -= 8;
    }
    bw->used_ = 0;
  }
  return bw->buf_;
}